

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::to_wave_action(Application *this)

{
  Scene *pSVar1;
  _Rb_tree_node_base *p_Var2;
  
  DynamicScene::XFormWidget::exitObjectMode(this->scene->elementTransform);
  DynamicScene::XFormWidget::enterTransformedMode(this->scene->elementTransform);
  DynamicScene::XFormWidget::setTranslate(this->scene->elementTransform);
  DynamicScene::Scene::removeObject(this->scene,&this->scene->elementTransform->super_SceneObject);
  this->action = Wave;
  this->isGhosted = false;
  pSVar1 = this->scene;
  for (p_Var2 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    *(undefined1 *)(*(long *)(p_Var2 + 1) + 0xe9) = 0;
  }
  return;
}

Assistant:

void Application::to_wave_action()
{
  scene->elementTransform->exitObjectMode();
  scene->elementTransform->enterTransformedMode();
  scene->elementTransform->setTranslate();
  scene->removeObject(scene->elementTransform);
  action = Action::Wave;
  setGhosted(false);
}